

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O2

void __thiscall Assimp::ScaleProcess::Execute(ScaleProcess *this,aiScene *pScene)

{
  aiAnimation *paVar1;
  aiNodeAnim *paVar2;
  aiMesh *paVar3;
  aiBone *paVar4;
  aiAnimMesh *paVar5;
  uint __line;
  ulong uVar6;
  char *__assertion;
  uint boneID;
  uint animationChannel;
  ulong uVar7;
  uint posKey;
  ulong uVar8;
  long lVar9;
  float fVar10;
  aiVector3t<float> local_188;
  aiVector3t<float> local_178;
  float local_168;
  float local_164;
  aiScene *local_160;
  aiMatrix4x4t<float> temp_1;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> local_c8;
  aiQuaterniont<float> local_88;
  aiMatrix4x4t<float> local_70;
  
  fVar10 = this->mScale;
  if ((fVar10 == 1.0) && (!NAN(fVar10))) {
    return;
  }
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    if (pScene == (aiScene *)0x0) {
      __assertion = "nullptr != pScene";
      __line = 0x59;
    }
    else {
      if (pScene->mRootNode != (aiNode *)0x0) {
        local_160 = pScene;
        for (uVar6 = 0; uVar6 < local_160->mNumAnimations; uVar6 = uVar6 + 1) {
          paVar1 = local_160->mAnimations[uVar6];
          for (uVar7 = 0; uVar7 < paVar1->mNumChannels; uVar7 = uVar7 + 1) {
            paVar2 = paVar1->mChannels[uVar7];
            lVar9 = 8;
            for (uVar8 = 0; uVar8 < paVar2->mNumPositionKeys; uVar8 = uVar8 + 1) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&paVar2->mPositionKeys->mTime + lVar9),
                         this->mScale);
              lVar9 = lVar9 + 0x18;
            }
          }
        }
        for (uVar6 = 0; uVar6 < local_160->mNumMeshes; uVar6 = uVar6 + 1) {
          paVar3 = local_160->mMeshes[uVar6];
          lVar9 = 0;
          for (uVar7 = 0; uVar7 < paVar3->mNumVertices; uVar7 = uVar7 + 1) {
            aiVector3t<float>::operator*=
                      ((aiVector3t<float> *)((long)&paVar3->mVertices->x + lVar9),this->mScale);
            lVar9 = lVar9 + 0xc;
          }
          for (uVar7 = 0; uVar7 < paVar3->mNumBones; uVar7 = uVar7 + 1) {
            paVar4 = paVar3->mBones[uVar7];
            local_178.x = 0.0;
            local_178.y = 0.0;
            local_178.z = 0.0;
            local_188.x = 0.0;
            local_188.y = 0.0;
            local_188.z = 0.0;
            local_88.w = 1.0;
            local_88.x = 0.0;
            local_88.y = 0.0;
            local_88.z = 0.0;
            aiMatrix4x4t<float>::Decompose(&paVar4->mOffsetMatrix,&local_188,&local_88,&local_178);
            fVar10 = this->mScale;
            local_164 = local_178.x * fVar10;
            local_168 = local_178.y * fVar10;
            fVar10 = fVar10 * local_178.z;
            local_70.a2 = 0.0;
            local_70.a3 = 0.0;
            local_70.a4 = 0.0;
            local_70.b1 = 0.0;
            local_70.b3 = 0.0;
            local_70.b4 = 0.0;
            local_70.c1 = 0.0;
            local_70.c2 = 0.0;
            local_70.c4 = 0.0;
            local_70.d1 = 0.0;
            local_70.d2 = 0.0;
            local_70.d3 = 0.0;
            local_70.d4 = 1.0;
            local_70.a1 = local_188.x;
            local_70.b2 = local_188.y;
            local_70.c3 = local_188.z;
            aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)&temp_1,&local_88);
            local_c8.a1 = temp_1.a1;
            local_c8.a2 = temp_1.a2;
            local_c8.a3 = temp_1.a3;
            local_c8.a4 = 0.0;
            local_c8.b2 = temp_1.b1;
            local_c8.b1 = temp_1.a4;
            local_c8.b3 = temp_1.b2;
            local_c8.b4 = 0.0;
            local_c8.c1 = temp_1.b3;
            local_c8.c2 = temp_1.b4;
            local_c8.c3 = temp_1.c1;
            temp.a1 = 1.0;
            temp.a2 = 0.0;
            temp.a3 = 0.0;
            local_c8.c4 = 0.0;
            local_c8.d1 = 0.0;
            local_c8.d2 = 0.0;
            local_c8.d3 = 0.0;
            local_c8.d4 = 1.0;
            temp.a4 = local_164;
            temp.b1 = 0.0;
            temp.b2 = 1.0;
            temp.b3 = 0.0;
            temp.b4 = local_168;
            temp.c1 = 0.0;
            temp.c2 = 0.0;
            temp.c3 = 1.0;
            temp.d3 = 0.0;
            temp.d1 = 0.0;
            temp.d2 = 0.0;
            temp.d4 = 1.0;
            temp.c4 = fVar10;
            aiMatrix4x4t<float>::operator*=(&temp,&local_c8);
            temp_1.a2 = temp.a2;
            temp_1.a1 = temp.a1;
            temp_1.b4 = temp.b4;
            temp_1.b3 = temp.b3;
            temp_1.c4 = temp.c4;
            temp_1.c3 = temp.c3;
            temp_1.d4 = temp.d4;
            temp_1.d3 = temp.d3;
            temp_1.a3 = temp.a3;
            temp_1.a4 = temp.a4;
            temp_1.b1 = temp.b1;
            temp_1.b2 = temp.b2;
            temp_1.c1 = temp.c1;
            temp_1.c2 = temp.c2;
            temp_1.d1 = temp.d1;
            temp_1.d2 = temp.d2;
            aiMatrix4x4t<float>::operator*=(&temp_1,&local_70);
            (paVar4->mOffsetMatrix).a1 = temp_1.a1;
            (paVar4->mOffsetMatrix).a2 = temp_1.a2;
            (paVar4->mOffsetMatrix).a3 = temp_1.a3;
            (paVar4->mOffsetMatrix).a4 = temp_1.a4;
            (paVar4->mOffsetMatrix).b1 = temp_1.b1;
            (paVar4->mOffsetMatrix).b2 = temp_1.b2;
            (paVar4->mOffsetMatrix).b3 = temp_1.b3;
            (paVar4->mOffsetMatrix).b4 = temp_1.b4;
            (paVar4->mOffsetMatrix).c1 = temp_1.c1;
            (paVar4->mOffsetMatrix).c2 = temp_1.c2;
            (paVar4->mOffsetMatrix).c3 = temp_1.c3;
            (paVar4->mOffsetMatrix).c4 = temp_1.c4;
            (paVar4->mOffsetMatrix).d1 = temp_1.d1;
            (paVar4->mOffsetMatrix).d2 = temp_1.d2;
            (paVar4->mOffsetMatrix).d3 = temp_1.d3;
            (paVar4->mOffsetMatrix).d4 = temp_1.d4;
          }
          for (uVar7 = 0; uVar7 < paVar3->mNumAnimMeshes; uVar7 = uVar7 + 1) {
            paVar5 = paVar3->mAnimMeshes[uVar7];
            lVar9 = 0;
            for (uVar8 = 0; uVar8 < paVar5->mNumVertices; uVar8 = uVar8 + 1) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&paVar5->mVertices->x + lVar9),this->mScale);
              lVar9 = lVar9 + 0xc;
            }
          }
        }
        traverseNodes(this,local_160->mRootNode,0);
        return;
      }
      __assertion = "nullptr != pScene->mRootNode";
      __line = 0x5a;
    }
  }
  else {
    __assertion = "mScale != 0";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ScaleProcess.cpp"
                ,__line,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
}

Assistant:

void ScaleProcess::Execute( aiScene* pScene ) {
    if(mScale == 1.0f)  {
        return; // nothing to scale
    }
    
    ai_assert( mScale != 0 );
    ai_assert( nullptr != pScene );
    ai_assert( nullptr != pScene->mRootNode );

    if ( nullptr == pScene ) {
        return;
    }

    if ( nullptr == pScene->mRootNode ) {
        return;
    }
    
    // Process animations and update position transform to new unit system
    for( unsigned int animationID = 0; animationID < pScene->mNumAnimations; animationID++ )
    {
        aiAnimation* animation = pScene->mAnimations[animationID];

        for( unsigned int animationChannel = 0; animationChannel < animation->mNumChannels; animationChannel++)
        {
            aiNodeAnim* anim = animation->mChannels[animationChannel];
            
            for( unsigned int posKey = 0; posKey < anim->mNumPositionKeys; posKey++)
            {
                aiVectorKey& vectorKey = anim->mPositionKeys[posKey];
                vectorKey.mValue *= mScale;
            }
        }
    }

    for( unsigned int meshID = 0; meshID < pScene->mNumMeshes; meshID++)
    {
        aiMesh *mesh = pScene->mMeshes[meshID]; 
        
        // Reconstruct mesh vertexes to the new unit system
        for( unsigned int vertexID = 0; vertexID < mesh->mNumVertices; vertexID++)
        {
            aiVector3D& vertex = mesh->mVertices[vertexID];
            vertex *= mScale;
        }


        // bone placement / scaling
        for( unsigned int boneID = 0; boneID < mesh->mNumBones; boneID++)
        {
            // Reconstruct matrix by transform rather than by scale 
            // This prevent scale values being changed which can
            // be meaningful in some cases 
            // like when you want the modeller to see 1:1 compatibility.
            aiBone* bone = mesh->mBones[boneID];

            aiVector3D pos, scale;
            aiQuaternion rotation;

            bone->mOffsetMatrix.Decompose( scale, rotation, pos);
            
            aiMatrix4x4 translation;
            aiMatrix4x4::Translation( pos * mScale, translation );
            
            aiMatrix4x4 scaling;
            aiMatrix4x4::Scaling( aiVector3D(scale), scaling );

            aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

            bone->mOffsetMatrix = translation * RotMatrix * scaling;
        }


        // animation mesh processing
        // convert by position rather than scale.
        for( unsigned int animMeshID = 0; animMeshID < mesh->mNumAnimMeshes; animMeshID++)
        {
            aiAnimMesh * animMesh = mesh->mAnimMeshes[animMeshID];
            
            for( unsigned int vertexID = 0; vertexID < animMesh->mNumVertices; vertexID++)
            {
                aiVector3D& vertex = animMesh->mVertices[vertexID];
                vertex *= mScale;
            }
        }
    }

    traverseNodes( pScene->mRootNode );
}